

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O2

EStatusCode __thiscall PDFModifiedPage::WritePage(PDFModifiedPage *this)

{
  size_t sVar1;
  bool bVar2;
  EStatusCode EVar3;
  EPDFObjectType EVar4;
  ObjectsContext *this_00;
  IndirectObjectsReferenceRegistry *pIVar5;
  PDFObject **indirectObjectID;
  PDFDocumentCopyingContext *this_01;
  PDFParser *pPVar6;
  ObjectIDType inObjectID;
  PDFDictionary *pPVar7;
  Trace *pTVar8;
  ObjectsContext *this_02;
  DictionaryContext *this_03;
  string *psVar9;
  ObjectIDTypeSet *pOVar10;
  PDFObject *pPVar11;
  DocumentContext *pDVar12;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_04;
  _Base_ptr p_Var13;
  IByteWriter *inObjectID_00;
  PDFStream *pPVar14;
  IByteWriter *pIVar15;
  RefCountPtr<PDFIndirectObjectReference> *this_05;
  pointer inName;
  PrimitiveObjectsWriter primitivesWriter;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> refs;
  PDFObjectCastPtr<PDFArray> anArray;
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  allocator<char> local_189;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  formResourcesNames;
  ObjectIDType local_168;
  PDFObjectCastPtr<PDFDictionary> inheritedResources;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  EVar3 = EndContentContext(this);
  this_01 = (PDFDocumentCopyingContext *)0x0;
  if (EVar3 != eSuccess) goto LAB_001a02a9;
  if (this->mIsDirty != true) {
    EVar3 = eSuccess;
    goto LAB_001a02a9;
  }
  this_00 = PDFWriter::GetObjectsContext(this->mWriter);
  pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
  indirectObjectID = (PDFObject **)IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar5);
  this_01 = PDFWriter::CreatePDFCopyingContextForModifiedFile(this->mWriter);
  pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
  inObjectID = PDFParser::GetPageObjectID(pPVar6,this->mPageIndex);
  pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
  pPVar7 = PDFParser::ParsePage(pPVar6,this->mPageIndex);
  pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(&pPVar7->super_PDFObject);
  pageDictionaryObject.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  if (pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0) {
    RefCountPtr<PDFDictionary>::~RefCountPtr(&pageDictionaryObject.super_RefCountPtr<PDFDictionary>)
    ;
    return eFailure;
  }
  PDFDictionary::GetIterator
            (&pageDictionaryObjectIt,pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue);
  EVar3 = ObjectsContext::StartModifiedIndirectObject(this_00,inObjectID);
  if (EVar3 == eSuccess) {
    this_02 = PDFWriter::GetObjectsContext(this->mWriter);
    this_03 = ObjectsContext::StartDictionary(this_02);
    while (bVar2 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::MoveNext(&pageDictionaryObjectIt.
                               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                             ),
          pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue, bVar2) {
      psVar9 = PDFName::GetValue_abi_cxx11_
                         (*(PDFName **)
                           (pageDictionaryObjectIt.
                            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            .mCurrentPosition._M_node + 1));
      bVar2 = std::operator!=(psVar9,"Resources");
      if (bVar2) {
        psVar9 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (pageDictionaryObjectIt.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        bVar2 = std::operator!=(psVar9,"Contents");
        if (bVar2) {
          psVar9 = PDFName::GetValue_abi_cxx11_
                             (*(PDFName **)
                               (pageDictionaryObjectIt.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mCurrentPosition._M_node + 1));
          bVar2 = std::operator!=(psVar9,"Annots");
          if (bVar2) {
            psVar9 = PDFName::GetValue_abi_cxx11_
                               (*(PDFName **)
                                 (pageDictionaryObjectIt.
                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  .mCurrentPosition._M_node + 1));
            DictionaryContext::WriteKey(this_03,psVar9);
            PDFDocumentCopyingContext::CopyDirectObjectAsIs
                      (this_01,(PDFObject *)
                               pageDictionaryObjectIt.
                               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               .mCurrentPosition._M_node[1]._M_parent);
          }
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Annots",(allocator<char> *)&refs);
    bVar2 = PDFDictionary::Exists(pPVar7,&local_130);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_130);
LAB_0019f6e9:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&refs,"Annots",(allocator<char> *)&anArray);
      DictionaryContext::WriteKey(this_03,(string *)&refs);
      std::__cxx11::string::~string((string *)&refs);
      ObjectsContext::StartArray(this_00);
      pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Annots",(allocator<char> *)&refs);
      bVar2 = PDFDictionary::Exists(pPVar7,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&refs,"Annots",(allocator<char> *)&formResourcesNames);
        pPVar11 = PDFParser::QueryDictionaryObject(pPVar6,pPVar7,(string *)&refs);
        anArray.super_RefCountPtr<PDFArray>.mValue = PDFObjectCast<PDFArray>(pPVar11);
        anArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
             (_func_int **)&PTR__RefCountPtr_0036d8f8;
        std::__cxx11::string::~string((string *)&refs);
        PDFArray::GetIterator(anArray.super_RefCountPtr<PDFArray>.mValue);
        while (refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
               .mCurrentPosition._M_current !=
               refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
               .mEndPosition._M_current) {
          if (refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
              mFirstMove == true) {
            refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            _8_8_ = refs.
                    super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    ._8_8_ & 0xffffffffffffff00;
          }
          else {
            refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            mCurrentPosition._M_current =
                 refs.
                 super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                 mCurrentPosition._M_current + 1;
            if (refs.
                super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                mCurrentPosition._M_current ==
                refs.
                super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                mEndPosition._M_current) break;
          }
          PDFDocumentCopyingContext::CopyDirectObjectAsIs
                    (this_01,*refs.
                              super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                              .mCurrentPosition._M_current);
        }
        RefCountPtr<PDFArray>::~RefCountPtr(&anArray.super_RefCountPtr<PDFArray>);
      }
      pDVar12 = PDFWriter::GetDocumentContext(this->mWriter);
      this_04 = &PDFHummus::DocumentContext::GetAnnotations(pDVar12)->_M_t;
      if ((this_04->_M_impl).super__Rb_tree_header._M_node_count != 0) {
        for (p_Var13 = (this_04->_M_impl).super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(this_04->_M_impl).super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          ObjectsContext::WriteNewIndirectObjectReference
                    (this_00,*(ObjectIDType *)(p_Var13 + 1),eTokenSeparatorSpace);
        }
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::clear(this_04);
      ObjectsContext::EndArray(this_00,eTokenSeparatorEndLine);
    }
    else {
      pDVar12 = PDFWriter::GetDocumentContext(this->mWriter);
      pOVar10 = PDFHummus::DocumentContext::GetAnnotations(pDVar12);
      sVar1 = (pOVar10->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::~string((string *)&local_130);
      if (sVar1 != 0) goto LAB_0019f6e9;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refs,"Contents",(allocator<char> *)&anArray);
    DictionaryContext::WriteKey(this_03,(string *)&refs);
    std::__cxx11::string::~string((string *)&refs);
    pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Contents",(allocator<char> *)&refs);
    bVar2 = PDFDictionary::Exists(pPVar7,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      ObjectsContext::StartArray(this_00);
      if (this->mEnsureContentEncapsulation == true) {
        pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
        local_168 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar5);
        ObjectsContext::WriteNewIndirectObjectReference(this_00,local_168,eTokenSeparatorSpace);
      }
      else {
        local_168 = 0;
      }
      pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
      pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&refs,"Contents",(allocator<char> *)&formResourcesNames);
      anArray.super_RefCountPtr<PDFArray>.mValue =
           (PDFArray *)PDFParser::QueryDictionaryObject(pPVar6,pPVar7,(string *)&refs);
      anArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
           (_func_int **)&PTR__RefCountPtr_0036d890;
      std::__cxx11::string::~string((string *)&refs);
      EVar4 = PDFObject::GetType(&(anArray.super_RefCountPtr<PDFArray>.mValue)->super_PDFObject);
      pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
      if (EVar4 == ePDFObjectStream) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Contents",(allocator<char> *)&formResourcesNames);
        pPVar11 = PDFDictionary::QueryDirectObject(pPVar7,&local_90);
        refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>._8_8_
             = PDFObjectCast<PDFIndirectObjectReference>(pPVar11);
        refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
        mEndPosition._M_current = (PDFObject **)&PTR__RefCountPtr_0036db20;
        std::__cxx11::string::~string((string *)&local_90);
        ObjectsContext::WriteIndirectObjectReference
                  (this_00,*(ObjectIDType *)
                            (refs.
                             super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                             ._8_8_ + 0x48),
                   *(unsigned_long *)
                    (refs.
                     super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                     ._8_8_ + 0x50),eTokenSeparatorSpace);
        this_05 = (RefCountPtr<PDFIndirectObjectReference> *)&refs;
LAB_0019facc:
        RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(this_05);
      }
      else {
        EVar4 = PDFObject::GetType(&(anArray.super_RefCountPtr<PDFArray>.mValue)->super_PDFObject);
        if (EVar4 == ePDFObjectArray) {
          PDFArray::GetIterator(anArray.super_RefCountPtr<PDFArray>.mValue);
          formResourcesNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          formResourcesNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__RefCountPtr_0036db20;
          while (refs.
                 super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                 mCurrentPosition._M_current !=
                 refs.
                 super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                 mEndPosition._M_current) {
            if (refs.
                super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                mFirstMove == true) {
              refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
              _8_8_ = refs.
                      super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                      ._8_8_ & 0xffffffffffffff00;
            }
            else {
              refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
              mCurrentPosition._M_current =
                   refs.
                   super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                   mCurrentPosition._M_current + 1;
              if (refs.
                  super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                  mCurrentPosition._M_current ==
                  refs.
                  super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                  mEndPosition._M_current) break;
            }
            PDFObjectCastPtr<PDFIndirectObjectReference>::operator=
                      ((PDFObjectCastPtr<PDFIndirectObjectReference> *)&formResourcesNames,
                       *refs.
                        super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                        .mCurrentPosition._M_current);
            ObjectsContext::WriteIndirectObjectReference
                      (this_00,formResourcesNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[2]._M_string_length,
                       formResourcesNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[2].field_2._M_allocated_capacity,
                       eTokenSeparatorSpace);
          }
          this_05 = (RefCountPtr<PDFIndirectObjectReference> *)&formResourcesNames;
          goto LAB_0019facc;
        }
      }
      ObjectsContext::WriteNewIndirectObjectReference
                (this_00,(ObjectIDType)indirectObjectID,eTokenSeparatorSpace);
      ObjectsContext::EndArray(this_00,eTokenSeparatorNone);
      ObjectsContext::EndLine(this_00);
      RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&anArray);
    }
    else {
      refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
      mFirstMove = false;
      refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>._9_7_ =
           0;
      refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
      mEndPosition._M_current = indirectObjectID;
      ObjectsContext::WriteIndirectObjectReference
                (this_00,(ObjectReference *)&refs,eTokenSeparatorSpace);
      local_168 = 0;
    }
    formResourcesNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    formResourcesNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    formResourcesNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refs,"Resources",(allocator<char> *)&anArray);
    DictionaryContext::WriteKey(this_03,(string *)&refs);
    std::__cxx11::string::~string((string *)&refs);
    pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Resources",(allocator<char> *)&refs);
    bVar2 = PDFDictionary::Exists(pPVar7,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Resources",(allocator<char> *)&refs);
      pPVar11 = PDFDictionary::QueryDirectObject(pPVar7,&local_f0);
      anArray.super_RefCountPtr<PDFArray>.mValue =
           (PDFArray *)PDFObjectCast<PDFIndirectObjectReference>(pPVar11);
      anArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
           (_func_int **)&PTR__RefCountPtr_0036db20;
      std::__cxx11::string::~string((string *)&local_f0);
      pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
      if (anArray.super_RefCountPtr<PDFArray>.mValue == (PDFArray *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Resources",(allocator<char> *)&refs);
        pPVar11 = PDFDictionary::QueryDirectObject(pPVar7,&local_110);
        pPVar7 = PDFObjectCast<PDFDictionary>(pPVar11);
        primitivesWriter.mStreamForWriting = (IByteWriter *)&PTR__RefCountPtr_0036d8c0;
        std::__cxx11::string::~string((string *)&local_110);
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        WriteModifiedResourcesDict_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&refs,this,pPVar6,pPVar7,this_00,this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&formResourcesNames,&refs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&refs);
        RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)&primitivesWriter);
        pIVar15 = (IByteWriter *)0x0;
LAB_0019fe29:
        inObjectID_00 = (IByteWriter *)0x0;
      }
      else {
        pIVar15 = (IByteWriter *)
                  ((anArray.super_RefCountPtr<PDFArray>.mValue)->mValues).
                  super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
        IndirectObjectsReferenceRegistry::GetObjectWriteInformation
                  ((GetObjectWriteInformationResult *)&refs,pIVar5,(ObjectIDType)pIVar15);
        if (((char)refs.
                   super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
                   mEndPosition._M_current != '\x01') ||
           (refs.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            _9_1_ != '\x01')) {
          primitivesWriter.mStreamForWriting = pIVar15;
          DictionaryContext::WriteObjectReferenceValue(this_03,(ObjectReference *)&primitivesWriter)
          ;
          goto LAB_0019fe29;
        }
        pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
        inObjectID_00 = (IByteWriter *)IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar5)
        ;
        primitivesWriter.mStreamForWriting = inObjectID_00;
        DictionaryContext::WriteObjectReferenceValue(this_03,(ObjectReference *)&primitivesWriter);
      }
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr
                ((RefCountPtr<PDFIndirectObjectReference> *)&anArray);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Parent",(allocator<char> *)&anArray);
      bVar2 = PDFDictionary::Exists(pPVar7,&local_d0);
      if (bVar2) {
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        pPVar7 = pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue;
        std::__cxx11::string::string<std::allocator<char>>((string *)&refs,"Parent",&local_189);
        pPVar11 = PDFParser::QueryDictionaryObject(pPVar6,pPVar7,(string *)&refs);
      }
      else {
        pPVar11 = (PDFObject *)0x0;
      }
      pPVar7 = PDFObjectCast<PDFDictionary>(pPVar11);
      primitivesWriter.mStreamForWriting = (IByteWriter *)&PTR__RefCountPtr_0036d8c0;
      if (bVar2) {
        std::__cxx11::string::~string((string *)&refs);
      }
      std::__cxx11::string::~string((string *)&local_d0);
      if (pPVar7 == (PDFDictionary *)0x0) {
        WriteNewResourcesDictionary_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&anArray,this,this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&formResourcesNames,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&anArray);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&anArray);
      }
      else {
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        pPVar11 = findInheritedResources(this,pPVar6,pPVar7);
        inheritedResources.super_RefCountPtr<PDFDictionary>.mValue =
             PDFObjectCast<PDFDictionary>(pPVar11);
        inheritedResources.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
             (_func_int **)&PTR__RefCountPtr_0036d8c0;
        if (inheritedResources.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0) {
          WriteNewResourcesDictionary_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&anArray,this,this_00);
        }
        else {
          pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
          WriteModifiedResourcesDict_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&anArray,this,pPVar6,
                     inheritedResources.super_RefCountPtr<PDFDictionary>.mValue,this_00,this_01);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&formResourcesNames,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&anArray);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&anArray);
        RefCountPtr<PDFDictionary>::~RefCountPtr
                  (&inheritedResources.super_RefCountPtr<PDFDictionary>);
      }
      RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)&primitivesWriter);
      pIVar15 = (IByteWriter *)0x0;
      inObjectID_00 = (IByteWriter *)0x0;
    }
    ObjectsContext::EndDictionary(this_00,this_03);
    ObjectsContext::EndIndirectObject(this_00);
    if (pIVar15 == (IByteWriter *)0x0) {
LAB_0019ffbd:
      PrimitiveObjectsWriter::PrimitiveObjectsWriter(&primitivesWriter,(IByteWriter *)0x0);
      if (local_168 == 0) {
LAB_001a00a9:
        EVar3 = ObjectsContext::StartNewIndirectObject(this_00,(ObjectIDType)indirectObjectID);
        if (EVar3 == eSuccess) {
          pPVar14 = ObjectsContext::StartPDFStream(this_00,(DictionaryContext *)0x0,false);
          pIVar15 = PDFStream::GetWriteStream(pPVar14);
          PrimitiveObjectsWriter::SetStreamForWriting(&primitivesWriter,pIVar15);
          if (local_168 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&anArray,"Q",(allocator<char> *)&inheritedResources);
            PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
            std::__cxx11::string::~string((string *)&anArray);
          }
          for (inName = formResourcesNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              inName != formResourcesNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&anArray,"q",(allocator<char> *)&inheritedResources);
            PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
            std::__cxx11::string::~string((string *)&anArray);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,1,eTokenSeparatorSpace);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,0,eTokenSeparatorSpace);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,0,eTokenSeparatorSpace);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,1,eTokenSeparatorSpace);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,0,eTokenSeparatorSpace);
            PrimitiveObjectsWriter::WriteInteger(&primitivesWriter,0,eTokenSeparatorSpace);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&anArray,"cm",(allocator<char> *)&inheritedResources);
            PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
            std::__cxx11::string::~string((string *)&anArray);
            PrimitiveObjectsWriter::WriteName(&primitivesWriter,inName,eTokenSeparatorSpace);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&anArray,"Do",(allocator<char> *)&inheritedResources);
            PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
            std::__cxx11::string::~string((string *)&anArray);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&anArray,"Q",(allocator<char> *)&inheritedResources);
            PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
            std::__cxx11::string::~string((string *)&anArray);
          }
          EVar3 = ObjectsContext::EndPDFStream(this_00,pPVar14);
          PDFStream::~PDFStream(pPVar14);
          operator_delete(pPVar14,0xf0);
        }
        else {
          pTVar8 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar8,"PDFModifiedPage::WritePage, failed to start content object %ld",
                            indirectObjectID);
        }
      }
      else {
        EVar3 = ObjectsContext::StartNewIndirectObject(this_00,local_168);
        if (EVar3 == eSuccess) {
          pPVar14 = ObjectsContext::StartPDFStream(this_00,(DictionaryContext *)0x0,false);
          pIVar15 = PDFStream::GetWriteStream(pPVar14);
          PrimitiveObjectsWriter::SetStreamForWriting(&primitivesWriter,pIVar15);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&anArray,"q",(allocator<char> *)&inheritedResources);
          PrimitiveObjectsWriter::WriteKeyword(&primitivesWriter,(string *)&anArray);
          std::__cxx11::string::~string((string *)&anArray);
          EVar3 = ObjectsContext::EndPDFStream(this_00,pPVar14);
          PDFStream::~PDFStream(pPVar14);
          operator_delete(pPVar14,0xf0);
          if (EVar3 == eSuccess) goto LAB_001a00a9;
          pTVar8 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar8,
                            "PDFModifiedPage::WritePage, failed to end encapsulating stream %ld",
                            local_168);
        }
        else {
          pTVar8 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar8,
                            "PDFModifiedPage::WritePage, failed to start encapsulating object %ld",
                            local_168);
        }
      }
      PrimitiveObjectsWriter::~PrimitiveObjectsWriter(&primitivesWriter);
    }
    else if (inObjectID_00 == (IByteWriter *)0x0) {
      EVar3 = ObjectsContext::StartModifiedIndirectObject(this_00,(ObjectIDType)pIVar15);
      if (EVar3 == eSuccess) goto LAB_0019ff3b;
      pTVar8 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar8,
                        "PDFModifiedPage::WritePage, failed to start modified resources object %ld",
                        pIVar15);
    }
    else {
      EVar3 = ObjectsContext::StartNewIndirectObject(this_00,(ObjectIDType)inObjectID_00);
      if (EVar3 == eSuccess) {
LAB_0019ff3b:
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        pPVar11 = PDFParser::ParseNewObject(pPVar6,(ObjectIDType)pIVar15);
        pPVar7 = PDFObjectCast<PDFDictionary>(pPVar11);
        primitivesWriter.mStreamForWriting = (IByteWriter *)&PTR__RefCountPtr_0036d8c0;
        pPVar6 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_01);
        WriteModifiedResourcesDict_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&anArray,this,pPVar6,pPVar7,this_00,this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&formResourcesNames);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&anArray);
        ObjectsContext::EndIndirectObject(this_00);
        RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)&primitivesWriter);
        goto LAB_0019ffbd;
      }
      pTVar8 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar8,
                        "PDFModifiedPage::WritePage, failed to start new resources object %ld",
                        inObjectID_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&formResourcesNames);
  }
  else {
    pTVar8 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar8,"PDFModifiedPage::WritePage, failed to start modified page object %ld",
                      inObjectID);
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&pageDictionaryObject.super_RefCountPtr<PDFDictionary>);
  PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this_01);
LAB_001a02a9:
  operator_delete(this_01,0xd0);
  return EVar3;
}

Assistant:

PDFHummus::EStatusCode PDFModifiedPage::WritePage()
{
	EStatusCode status = EndContentContext(); // just in case someone forgot to close the latest content context
	PDFDocumentCopyingContext* copyingContext = NULL;

	do {
		if (status != eSuccess || !mIsDirty) {
			break;
		}

		// allocate an object ID for the new contents stream (for placing the form)
		// we first create the modified page object, so that we can define a name for the new form xobject
		// that is unique
		ObjectsContext& objectContext = mWriter->GetObjectsContext();
		ObjectIDType newContentObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
		ObjectIDType newEncapsulatingObjectID = 0;


		// create a copying context, so we can copy the page dictionary, and modify its contents + resources dict
		copyingContext = mWriter->CreatePDFCopyingContextForModifiedFile();

		// get the page object
		ObjectIDType pageObjectID = copyingContext->GetSourceDocumentParser()->GetPageObjectID(mPageIndex);
		PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = copyingContext->GetSourceDocumentParser()->ParsePage(mPageIndex);
		if (!pageDictionaryObject)
		    return eFailure;
		MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();

		// create modified page object
		status = objectContext.StartModifiedIndirectObject(pageObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified page object %ld", pageObjectID);
			break;
		}
		DictionaryContext* modifiedPageObject = mWriter->GetObjectsContext().StartDictionary();

		// copy all elements of the page to the new page object, but the "Contents", "Resources" and "Annots" elements
		while (pageDictionaryObjectIt.MoveNext())
		{
			if (pageDictionaryObjectIt.GetKey()->GetValue() != "Resources" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Contents" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Annots")
			{
				modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
				copyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
			}
		}

		// Write new annotations entry, joining existing annotations, and new ones (from links attaching or what not)
		if (pageDictionaryObject->Exists("Annots") || mWriter->GetDocumentContext().GetAnnotations().size() > 0)
		{
			modifiedPageObject->WriteKey("Annots");
			objectContext.StartArray();

			// write old annots, if any exist
			if(pageDictionaryObject->Exists("Annots")) {
				PDFObjectCastPtr<PDFArray> anArray(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Annots"));
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				while (refs.MoveNext())
					copyingContext->CopyDirectObjectAsIs(refs.GetItem());

			}

			// write new annots from links
			ObjectIDTypeSet& annotations = mWriter->GetDocumentContext().GetAnnotations();
			if (annotations.size() > 0)
			{
				ObjectIDTypeSet::iterator it = annotations.begin();
				for (; it != annotations.end(); ++it)
					objectContext.WriteNewIndirectObjectReference(*it);
			}
			annotations.clear();
			objectContext.EndArray(eTokenSeparatorEndLine);

		}

		// Write new contents entry, joining the existing contents with the new one. take care of various scenarios of the existing Contents
		modifiedPageObject->WriteKey("Contents");
		if (!pageDictionaryObject->Exists("Contents"))
		{	// no contents
			objectContext.WriteIndirectObjectReference(newContentObjectID);
		}
		else
		{
			objectContext.StartArray();
			if (mEnsureContentEncapsulation)
			{
				newEncapsulatingObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
				objectContext.WriteNewIndirectObjectReference(newEncapsulatingObjectID);
			}

			RefCountPtr<PDFObject> pageContent(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Contents"));
			if (pageContent->GetType() == PDFObject::ePDFObjectStream)
			{
				// single content stream. must be a refrence which points to it
				PDFObjectCastPtr<PDFIndirectObjectReference> ref(pageDictionaryObject->QueryDirectObject("Contents"));
				objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
			}
			else if (pageContent->GetType() == PDFObject::ePDFObjectArray)
			{
				PDFArray* anArray = (PDFArray*)pageContent.GetPtr();

				// multiple content streams
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				PDFObjectCastPtr<PDFIndirectObjectReference> ref;
				while (refs.MoveNext())
				{
					ref = refs.GetItem();
					objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
				}

			}
			else {
				// this basically means no content...or whatever. just ignore.
			}

			objectContext.WriteNewIndirectObjectReference(newContentObjectID);
			objectContext.EndArray();
			objectContext.EndLine();
		}

		// Write a new resource entry. copy all but the "XObject" entry, which needs to be modified. Just for kicks i'm keeping the original 
		// form (either direct dictionary, or indirect object)
		ObjectIDType resourcesIndirect = 0;
		ObjectIDType newResourcesIndirect = 0;
		vector<string> formResourcesNames;

		modifiedPageObject->WriteKey("Resources");
		if (!pageDictionaryObject->Exists("Resources"))
		{
			// check if there's inherited dict. if so - write directly as a modified version
			PDFObjectCastPtr<PDFDictionary> parentDict(
				pageDictionaryObject->Exists("Parent") ? 
					copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Parent"): 
					NULL);
			if(!parentDict) {
				formResourcesNames = WriteNewResourcesDictionary(objectContext);
			}
			else {
				PDFObjectCastPtr<PDFDictionary> inheritedResources = findInheritedResources(copyingContext->GetSourceDocumentParser(),parentDict.GetPtr());
				if(!inheritedResources) {
					formResourcesNames = WriteNewResourcesDictionary(objectContext);
				} else {
					formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), inheritedResources.GetPtr(), objectContext, copyingContext);
				}
			}
		}
		else
		{
			// resources may be direct, or indirect. if direct, write as is, adding the new form xobject, otherwise wait till page object ends and write then
			PDFObjectCastPtr<PDFIndirectObjectReference> resourceDictRef(pageDictionaryObject->QueryDirectObject("Resources"));
			if (!resourceDictRef)
			{
				PDFObjectCastPtr<PDFDictionary> resourceDict(pageDictionaryObject->QueryDirectObject("Resources"));
				formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			}
			else
			{
				resourcesIndirect = resourceDictRef->mObjectID;
				// later will write a modified version of the resources dictionary, with the new form.
				// only modify the resources dict object if wasn't already modified (can happen when sharing resources dict between multiple pages).
				// in the case where it was alrady modified, create a new resources dictionary that's a copy, and use it instead, to avoid overwriting
				// the previous modification
				GetObjectWriteInformationResult res = objectContext.GetInDirectObjectsRegistry().GetObjectWriteInformation(resourcesIndirect);
				if (res.first && res.second.mIsDirty)
				{
					newResourcesIndirect = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
					modifiedPageObject->WriteObjectReferenceValue(newResourcesIndirect);
				}
				else
					modifiedPageObject->WriteObjectReferenceValue(resourcesIndirect);
			}
		}

		objectContext.EndDictionary(modifiedPageObject);
		objectContext.EndIndirectObject();

		if (resourcesIndirect != 0)
		{
			if (newResourcesIndirect != 0) {
				status = objectContext.StartNewIndirectObject(newResourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start new resources object %ld", newResourcesIndirect);
					break;
				}				
			} else {
				status = objectContext.StartModifiedIndirectObject(resourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified resources object %ld", resourcesIndirect);
					break;
				}
			}


			PDFObjectCastPtr<PDFDictionary> resourceDict(copyingContext->GetSourceDocumentParser()->ParseNewObject(resourcesIndirect));
			formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			objectContext.EndIndirectObject();
		}

		// if required write encapsulation code, so that new stream is independent of graphic context of original
		PDFStream* newStream;
		PrimitiveObjectsWriter primitivesWriter;
		if (newEncapsulatingObjectID != 0)
		{
			status = objectContext.StartNewIndirectObject(newEncapsulatingObjectID);
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to start encapsulating object %ld", newEncapsulatingObjectID);
				break;
			}
			newStream = objectContext.StartPDFStream();
			primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());
			primitivesWriter.WriteKeyword("q");
			status = objectContext.EndPDFStream(newStream);
			delete newStream;
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to end encapsulating stream %ld", newEncapsulatingObjectID);
				break;
			}
		}

		// last but not least, create the actual content stream object, placing the form
		status = objectContext.StartNewIndirectObject(newContentObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start content object %ld", newContentObjectID);
			break;
		}		
		newStream = objectContext.StartPDFStream();
		primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());

		if (newEncapsulatingObjectID != 0) {
			primitivesWriter.WriteKeyword("Q");
		}

		vector<string>::iterator it = formResourcesNames.begin();
		for (; it != formResourcesNames.end(); ++it)
		{
			primitivesWriter.WriteKeyword("q");
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteKeyword("cm");
			primitivesWriter.WriteName(*it);
			primitivesWriter.WriteKeyword("Do");
			primitivesWriter.WriteKeyword("Q");
		}

		status = objectContext.EndPDFStream(newStream);

		delete newStream;
	} while (false);

	delete copyingContext;

	return status;
}